

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O2

void job_fin(job_t *job)

{
  size_t _ut_i;
  ulong uVar1;
  
  free(job->name);
  if ((job->cmdv).n != 0) {
    if ((job->cmdv).icd.dtor != (undefined1 *)0x0) {
      for (uVar1 = 0; uVar1 < (job->cmdv).i; uVar1 = uVar1 + 1) {
        (*(code *)(job->cmdv).icd.dtor)((job->cmdv).d + (job->cmdv).icd.sz * uVar1);
      }
    }
    free((job->cmdv).d);
  }
  (job->cmdv).n = 0;
  if ((job->envv).n != 0) {
    if ((job->envv).icd.dtor != (undefined1 *)0x0) {
      for (uVar1 = 0; uVar1 < (job->envv).i; uVar1 = uVar1 + 1) {
        (*(code *)(job->envv).icd.dtor)((job->envv).d + (job->envv).icd.sz * uVar1);
      }
    }
    free((job->envv).d);
  }
  (job->envv).n = 0;
  if ((job->depv).n != 0) {
    if ((job->depv).icd.dtor != (undefined1 *)0x0) {
      for (uVar1 = 0; uVar1 < (job->depv).i; uVar1 = uVar1 + 1) {
        (*(code *)(job->depv).icd.dtor)((job->depv).d + (job->depv).icd.sz * uVar1);
      }
    }
    free((job->depv).d);
  }
  (job->depv).n = 0;
  if ((job->rlim).n != 0) {
    if ((job->rlim).icd.dtor != (undefined1 *)0x0) {
      for (uVar1 = 0; uVar1 < (job->rlim).i; uVar1 = uVar1 + 1) {
        (*(code *)(job->rlim).icd.dtor)((job->rlim).d + (job->rlim).icd.sz * uVar1);
      }
    }
    free((job->rlim).d);
  }
  (job->rlim).n = 0;
  free(job->dir);
  free(job->out);
  free(job->err);
  free(job->in);
  return;
}

Assistant:

void job_fin(job_t *job) { 
  if (job->name) free(job->name);
  utarray_done(&job->cmdv); 
  utarray_done(&job->envv); 
  utarray_done(&job->depv); 
  utarray_done(&job->rlim); 
  if (job->dir) free(job->dir);
  if (job->out) free(job->out);
  if (job->err) free(job->err);
  if (job->in) free(job->in);
}